

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::pushError(Reader *this,Value *value,string *message)

{
  bool bVar1;
  long lVar2;
  undefined1 local_50 [24];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  Location local_18;
  
  lVar2 = (long)this->end_ - (long)this->begin_;
  if ((lVar2 < value->start_) || (lVar2 < value->limit_)) {
    bVar1 = false;
  }
  else {
    local_50._8_8_ = this->begin_ + value->start_;
    local_50._16_8_ = this->end_ + value->limit_;
    local_30 = 0;
    local_28._M_local_buf[0] = '\0';
    local_50._0_4_ = tokenError;
    local_38._M_p = (pointer)&local_28;
    std::__cxx11::string::_M_assign((string *)&local_38);
    local_18 = (Location)0x0;
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::push_back
              (&this->errors_,(value_type *)local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_p != &local_28) {
      operator_delete(local_38._M_p);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool Reader::pushError(const Value& value, const JSONCPP_STRING& message) {
  ptrdiff_t const length = end_ - begin_;
  if(value.getOffsetStart() > length
    || value.getOffsetLimit() > length)
    return false;
  Token token;
  token.type_ = tokenError;
  token.start_ = begin_ + value.getOffsetStart();
  token.end_ = end_ + value.getOffsetLimit();
  ErrorInfo info;
  info.token_ = token;
  info.message_ = message;
  info.extra_ = 0;
  errors_.push_back(info);
  return true;
}